

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie.c
# Opt level: O1

nn_trie_node ** nn_node_next(nn_trie_node *self,uint8_t c)

{
  byte bVar1;
  nn_trie_node *pnVar2;
  ulong uVar3;
  
  bVar1 = self->type;
  if ((ulong)bVar1 != 0) {
    if (bVar1 < 9) {
      pnVar2 = self + 1;
      uVar3 = 0;
      do {
        if (self->prefix[uVar3 + 10] == c) {
          return (nn_trie_node **)pnVar2;
        }
        uVar3 = uVar3 + 1;
        pnVar2 = (nn_trie_node *)(pnVar2->prefix + 2);
      } while (bVar1 != uVar3);
    }
    else {
      bVar1 = (self->u).sparse.children[0];
      if ((bVar1 <= c) && (c <= (self->u).sparse.children[1])) {
        return (nn_trie_node **)((long)self + ((ulong)c - (ulong)bVar1) * 8 + 0x18);
      }
    }
  }
  return (nn_trie_node **)0x0;
}

Assistant:

struct nn_trie_node **nn_node_next (struct nn_trie_node *self, uint8_t c)
{
    /*  Finds the pointer to the next node based on the supplied character.
        If there is no such pointer, it returns NULL. */

    int i;

    if (self->type == 0)
        return NULL;

    /*  Sparse mode. */
    if (self->type <= 8) {
        for (i = 0; i != self->type; ++i)
            if (self->u.sparse.children [i] == c)
                return nn_node_child (self, i);
        return NULL;
    }

    /*  Dense mode. */
    if (c < self->u.dense.min || c > self->u.dense.max)
        return NULL;
    return nn_node_child (self, c - self->u.dense.min);
}